

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_number(double number)

{
  int iVar1;
  JSON_Value *pJVar2;
  int iVar3;
  JSON_Value *new_value;
  double number_local;
  
  if (!NAN(number)) {
    iVar3 = 1;
    if ((long)number < 0) {
      iVar3 = -1;
    }
    iVar1 = 0;
    if (ABS(number) == INFINITY) {
      iVar1 = iVar3;
    }
    if (iVar1 == 0) {
      pJVar2 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar2 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
      pJVar2->parent = (JSON_Value *)0x0;
      pJVar2->type = 3;
      (pJVar2->value).number = number;
      return pJVar2;
    }
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value * json_value_init_number(double number) {
    JSON_Value *new_value = NULL;
    if (IS_NUMBER_INVALID(number)) {
        return NULL;
    }
    new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (new_value == NULL) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONNumber;
    new_value->value.number = number;
    return new_value;
}